

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_new_node(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  int iVar1;
  REF_EDGE ref_edge;
  REF_DBL *pRVar2;
  bool bVar3;
  REF_GRID ref_grid;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  REF_CELL pRVar8;
  undefined8 uVar9;
  REF_DBL *pRVar10;
  long lVar11;
  REF_NODE pRVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  REF_INT node;
  REF_INT part;
  REF_GLOB global;
  uint local_80;
  int local_7c;
  REF_NODE local_78;
  int local_6c;
  REF_DBL *local_68;
  REF_GRID local_60;
  REF_MPI local_58;
  REF_DBL *local_50;
  REF_INT *local_48;
  REF_GEOM local_40;
  REF_CELL local_38;
  
  local_60 = ref_subdiv->grid;
  ref_edge = ref_subdiv->edge;
  local_58 = local_60->mpi;
  local_78 = local_60->node;
  local_40 = local_60->geom;
  if (0 < ref_edge->n) {
    lVar14 = 0;
    do {
      if ((ref_subdiv->mark[lVar14] == 0) && (iVar1 = ref_subdiv->node[lVar14], iVar1 != -1)) {
        local_7c = iVar1;
        uVar4 = ref_geom_remove_all(local_40,iVar1);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x390,"ref_subdiv_new_node",(ulong)uVar4,"remove geom from node");
          return uVar4;
        }
        uVar4 = ref_edge_part(ref_edge,(REF_INT)lVar14,&local_6c);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x391,"ref_subdiv_new_node",(ulong)uVar4,"edge part");
          return uVar4;
        }
        if (local_58->id == local_6c) {
          uVar4 = ref_node_remove(local_78,local_7c);
          if (uVar4 != 0) {
            uVar9 = 0x393;
            pcVar13 = "owned, rm node with global";
LAB_002034f5:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,uVar9,"ref_subdiv_new_node",(ulong)uVar4,pcVar13);
            local_80 = uVar4;
          }
        }
        else {
          uVar4 = ref_node_remove_without_global(local_78,local_7c);
          if (uVar4 != 0) {
            uVar9 = 0x396;
            pcVar13 = "ghost, rm node without global";
            goto LAB_002034f5;
          }
        }
        if (uVar4 != 0) {
          return local_80;
        }
        ref_subdiv->node[lVar14] = -1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < ref_edge->n);
  }
  uVar4 = ref_node_synchronize_globals(local_78);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x39c,
           "ref_subdiv_new_node",(ulong)uVar4,"sync glob");
    return uVar4;
  }
  if (0 < ref_edge->n) {
    lVar14 = 0;
    do {
      if ((ref_subdiv->mark[lVar14] != 0) && (ref_subdiv->node[lVar14] == -1)) {
        uVar4 = ref_edge_part(ref_edge,(REF_INT)lVar14,&local_6c);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x3a1,"ref_subdiv_new_node",(ulong)uVar4,"edge part");
          return uVar4;
        }
        if (local_58->id == local_6c) {
          uVar4 = ref_node_next_global(local_78,(REF_GLOB *)&local_38);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3a3,"ref_subdiv_new_node",(ulong)uVar4,"next global");
            return uVar4;
          }
          uVar4 = ref_node_add(local_78,(REF_GLOB)local_38,&local_7c);
          ref_grid = local_60;
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3a4,"ref_subdiv_new_node",(ulong)uVar4,"add node");
            return uVar4;
          }
          ref_subdiv->node[lVar14] = local_7c;
          uVar4 = ref_node_interpolate_edge
                            (local_78,ref_edge->e2n[lVar14 * 2],ref_edge->e2n[lVar14 * 2 + 1],0.5,
                             local_7c);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3a9,"ref_subdiv_new_node",(ulong)uVar4,"new node");
            return uVar4;
          }
          uVar4 = ref_geom_add_between
                            (ref_grid,ref_edge->e2n[lVar14 * 2],ref_edge->e2n[lVar14 * 2 + 1],0.5,
                             local_7c);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3ac,"ref_subdiv_new_node",(ulong)uVar4,"new node");
            return uVar4;
          }
          uVar4 = ref_geom_constrain(ref_grid,local_7c);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3ad,"ref_subdiv_new_node",(ulong)uVar4,"geom constraint");
            return uVar4;
          }
          uVar4 = ref_metric_interpolate_between
                            (ref_grid,ref_edge->e2n[lVar14 * 2],ref_edge->e2n[lVar14 * 2 + 1],
                             local_7c);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3b1,"ref_subdiv_new_node",(ulong)uVar4,"interp new metric");
            return uVar4;
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < ref_edge->n);
  }
  uVar4 = ref_node_shift_new_globals(local_78);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x3b6,
           "ref_subdiv_new_node",(ulong)uVar4,"shift glob");
    return uVar4;
  }
  iVar1 = ref_edge->n;
  if ((long)iVar1 < 0) {
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x3b8,
           "ref_subdiv_new_node","malloc edge_global of REF_GLOB negative");
    local_80 = 1;
  }
  else {
    __size = (long)iVar1 * 8;
    local_60 = (REF_GRID)malloc(__size);
    if (local_60 == (REF_GRID)0x0) {
      bVar3 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x3b8,"ref_subdiv_new_node","malloc edge_global of REF_GLOB NULL");
      local_80 = 2;
      local_60 = (REF_GRID)0x0;
    }
    else {
      bVar3 = true;
      if (iVar1 != 0) {
        memset(local_60,0xff,__size);
      }
    }
  }
  pRVar12 = local_78;
  if (!bVar3) {
    return local_80;
  }
  if ((long)ref_edge->n < 0) {
    local_80 = 1;
    pcVar13 = "malloc edge_part of REF_INT negative";
LAB_0020396f:
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x3b9,
           "ref_subdiv_new_node",pcVar13);
    local_48 = (REF_INT *)0x0;
  }
  else {
    local_48 = (REF_INT *)malloc((long)ref_edge->n << 2);
    if (local_48 == (REF_INT *)0x0) {
      local_80 = 2;
      pcVar13 = "malloc edge_part of REF_INT NULL";
      goto LAB_0020396f;
    }
    bVar3 = true;
    if (0 < ref_edge->n) {
      lVar14 = 0;
      do {
        local_48[lVar14] = -1;
        lVar14 = lVar14 + 1;
      } while (lVar14 < ref_edge->n);
    }
  }
  if (!bVar3) {
    return local_80;
  }
  uVar7 = (ulong)(uint)ref_edge->n;
  if (ref_edge->n < 0) {
    local_80 = 1;
    pcVar13 = "malloc edge_real of REF_DBL negative";
LAB_00203a1f:
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x3bb,
           "ref_subdiv_new_node",pcVar13);
    local_50 = (REF_DBL *)0x0;
  }
  else {
    local_50 = (REF_DBL *)malloc(uVar7 * 0x78);
    pRVar12 = local_78;
    if (local_50 == (REF_DBL *)0x0) {
      local_80 = 2;
      pcVar13 = "malloc edge_real of REF_DBL NULL";
      goto LAB_00203a1f;
    }
    bVar3 = true;
    if (uVar7 != 0) {
      uVar5 = 1;
      if (1 < (int)(uVar7 * 0xf)) {
        uVar5 = uVar7 * 0xf & 0xffffffff;
      }
      uVar7 = 0;
      do {
        local_50[uVar7] = -999.0;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
  }
  if (!bVar3) {
    return local_80;
  }
  if (pRVar12->naux < 1) {
    local_68 = (REF_DBL *)0x0;
    goto LAB_00203b24;
  }
  iVar1 = ref_edge->n;
  uVar4 = pRVar12->naux * iVar1;
  if ((int)uVar4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x3bf,
           "ref_subdiv_new_node","malloc edge_aux of REF_DBL negative");
    local_80 = 1;
LAB_00203b13:
    bVar3 = false;
    local_68 = (REF_DBL *)0x0;
  }
  else {
    local_68 = (REF_DBL *)malloc((ulong)uVar4 << 3);
    if (local_68 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x3bf,"ref_subdiv_new_node","malloc edge_aux of REF_DBL NULL");
      local_80 = 2;
      goto LAB_00203b13;
    }
    bVar3 = true;
    if (iVar1 != 0) {
      uVar7 = 1;
      if (1 < (int)uVar4) {
        uVar7 = (ulong)uVar4;
      }
      memset(local_68,0,uVar7 << 3);
    }
  }
  if (!bVar3) {
    return local_80;
  }
LAB_00203b24:
  if (0 < ref_edge->n) {
    lVar15 = 0;
    lVar14 = 0;
    pRVar10 = local_50;
    do {
      local_7c = ref_subdiv->node[lVar14];
      if (local_7c != -1) {
        uVar4 = ref_edge_part(ref_edge,(REF_INT)lVar14,&local_6c);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x3c4,"ref_subdiv_new_node",(ulong)uVar4,"edge part");
          return uVar4;
        }
        if (local_58->id == local_6c) {
          lVar6 = (long)local_7c;
          pRVar8 = (REF_CELL)0xffffffffffffffff;
          if (((-1 < lVar6) && (local_7c < local_78->max)) &&
             (pRVar8 = (REF_CELL)local_78->global[lVar6], (long)pRVar8 < 0)) {
            pRVar8 = (REF_CELL)0xffffffffffffffff;
          }
          local_60->cell[lVar14 + -2] = pRVar8;
          local_48[lVar14] = local_78->part[lVar6];
          pRVar2 = local_78->real;
          lVar6 = 0;
          do {
            pRVar10[lVar6] = pRVar2[local_7c * 0xf + lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0xf);
          iVar1 = local_78->naux;
          lVar6 = (long)iVar1;
          if (0 < lVar6) {
            pRVar2 = local_78->aux;
            lVar11 = 0;
            do {
              *(REF_DBL *)((long)local_68 + lVar11 * 8 + lVar15 * lVar6) =
                   pRVar2[local_7c * iVar1 + lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar6 != lVar11);
          }
        }
      }
      lVar14 = lVar14 + 1;
      pRVar10 = pRVar10 + 0xf;
      lVar15 = lVar15 + 8;
    } while (lVar14 < ref_edge->n);
  }
  local_80 = ref_edge_ghost_glob(ref_edge,local_58,(REF_GLOB *)local_60);
  pRVar12 = local_78;
  if (local_80 == 0) {
    local_80 = ref_edge_ghost_int(ref_edge,local_58,local_48);
    if (local_80 == 0) {
      local_80 = ref_edge_ghost_dbl(ref_edge,local_58,local_50,0xf);
      if (local_80 == 0) {
        if ((pRVar12->naux < 1) ||
           (local_80 = ref_edge_ghost_dbl(ref_edge,local_58,local_68,pRVar12->naux), local_80 == 0))
        {
          pRVar12 = local_78;
          if (0 < ref_edge->n) {
            lVar15 = 0;
            lVar14 = 0;
            pRVar10 = local_50;
            do {
              local_38 = local_60->cell[lVar14 + -2];
              if (local_38 != (REF_CELL)0xffffffffffffffff) {
                uVar4 = ref_node_add(pRVar12,(REF_GLOB)local_38,&local_7c);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x3df,"ref_subdiv_new_node",(ulong)uVar4,"add node");
                  return uVar4;
                }
                ref_subdiv->node[lVar14] = local_7c;
                local_78->part[local_7c] = local_48[lVar14];
                pRVar2 = local_78->real;
                lVar6 = 0;
                do {
                  pRVar2[(long)local_7c * 0xf + lVar6] = pRVar10[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 0xf);
                lVar6 = (long)local_78->naux;
                pRVar12 = local_78;
                if (0 < lVar6) {
                  pRVar2 = local_78->aux;
                  lVar11 = 0;
                  do {
                    pRVar2[local_7c * lVar6 + lVar11] =
                         *(REF_DBL *)((long)local_68 + lVar11 * 8 + lVar15 * lVar6);
                    lVar11 = lVar11 + 1;
                  } while (lVar6 != lVar11);
                }
              }
              lVar14 = lVar14 + 1;
              pRVar10 = pRVar10 + 0xf;
              lVar15 = lVar15 + 8;
            } while (lVar14 < ref_edge->n);
          }
          local_80 = ref_geom_ghost(local_40,pRVar12);
          if (local_80 == 0) {
            if (local_68 != (REF_DBL *)0x0) {
              free(local_68);
            }
            if (local_50 != (REF_DBL *)0x0) {
              free(local_50);
            }
            if (local_48 != (REF_INT *)0x0) {
              free(local_48);
            }
            local_80 = 0;
            if (local_60 != (REF_GRID)0x0) {
              free(local_60);
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x3eb,"ref_subdiv_new_node",(ulong)local_80,"fill new node geom");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x3d9,"ref_subdiv_new_node",(ulong)local_80,"aux ghost");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x3d5,"ref_subdiv_new_node",(ulong)local_80,"xyz ghost");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x3d3,"ref_subdiv_new_node",(ulong)local_80,"part ghost");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x3d2,
           "ref_subdiv_new_node",(ulong)local_80,"global ghost");
  }
  return local_80;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_new_node(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_MPI ref_mpi = ref_subdiv_mpi(ref_subdiv);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT edge, node, i;
  REF_GLOB global;
  REF_INT part;

  REF_GLOB *edge_global;
  REF_INT *edge_part;
  REF_DBL *edge_real;
  REF_DBL *edge_aux;

  /* remove previously created new_node that is unmarked */
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (!ref_subdiv_mark(ref_subdiv, edge) &&
        REF_EMPTY != ref_subdiv_node(ref_subdiv, edge)) {
      node = ref_subdiv_node(ref_subdiv, edge);
      RSS(ref_geom_remove_all(ref_geom, node), "remove geom from node");
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_remove(ref_node, node), "owned, rm node with global");
      } else {
        RSS(ref_node_remove_without_global(ref_node, node),
            "ghost, rm node without global");
      }
      ref_subdiv_node(ref_subdiv, edge) = REF_EMPTY;
    }
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (ref_subdiv_mark(ref_subdiv, edge) &&
        REF_EMPTY == ref_subdiv_node(ref_subdiv, edge)) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &node), "add node");
        ref_subdiv_node(ref_subdiv, edge) = node;
        RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                      ref_edge_e2n(ref_edge, 1, edge), 0.5,
                                      node),
            "new node");
        RSS(ref_geom_add_between(ref_grid, ref_edge_e2n(ref_edge, 0, edge),
                                 ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
            "new node");
        RSS(ref_geom_constrain(ref_grid, node), "geom constraint");
        RSS(ref_metric_interpolate_between(
                ref_grid, ref_edge_e2n(ref_edge, 0, edge),
                ref_edge_e2n(ref_edge, 1, edge), node),
            "interp new metric");
      }
    }
  }

  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  ref_malloc_init(edge_global, ref_edge_n(ref_edge), REF_GLOB, REF_EMPTY);
  ref_malloc_init(edge_part, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(edge_real, REF_NODE_REAL_PER * ref_edge_n(ref_edge), REF_DBL,
                  -999.0);
  edge_aux = NULL;
  if (ref_node_naux(ref_node) > 0)
    ref_malloc_init(edge_aux, ref_node_naux(ref_node) * ref_edge_n(ref_edge),
                    REF_DBL, 0.0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = ref_subdiv_node(ref_subdiv, edge);
    if (REF_EMPTY != node) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        edge_global[edge] = ref_node_global(ref_node, node);
        edge_part[edge] = ref_node_part(ref_node, node);
        for (i = 0; i < REF_NODE_REAL_PER; i++)
          edge_real[i + REF_NODE_REAL_PER * edge] =
              ref_node_real(ref_node, i, node);
        for (i = 0; i < ref_node_naux(ref_node); i++)
          edge_aux[i + ref_node_naux(ref_node) * edge] =
              ref_node_aux(ref_node, i, node);
      }
    }
  }

  RSS(ref_edge_ghost_glob(ref_edge, ref_mpi, edge_global), "global ghost");
  RSS(ref_edge_ghost_int(ref_edge, ref_mpi, edge_part), "part ghost");
  RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_real, REF_NODE_REAL_PER),
      "xyz ghost");
  if (ref_node_naux(ref_node) > 0)
    RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_aux,
                           ref_node_naux(ref_node)),
        "aux ghost");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    global = edge_global[edge];
    if (REF_EMPTY != global) {
      /* finds local if already inserted */
      RSS(ref_node_add(ref_node, global, &node), "add node");
      ref_subdiv_node(ref_subdiv, edge) = node;
      ref_node_part(ref_node, node) = edge_part[edge];
      for (i = 0; i < REF_NODE_REAL_PER; i++)
        ref_node_real(ref_node, i, node) =
            edge_real[i + REF_NODE_REAL_PER * edge];
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) =
            edge_aux[i + ref_node_naux(ref_node) * edge];
    }
  }

  RSS(ref_geom_ghost(ref_geom, ref_node), "fill new node geom");

  ref_free(edge_aux);
  ref_free(edge_real);
  ref_free(edge_part);
  ref_free(edge_global);

  return REF_SUCCESS;
}